

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

void __thiscall
TEST_SimpleString_StringFromConstSimpleString_Test::testBody
          (TEST_SimpleString_StringFromConstSimpleString_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  SimpleString local_30;
  SimpleString local_20;
  
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_20,"bla");
  StringFrom(&local_30);
  pcVar2 = SimpleString::asCharString(&local_30);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"bla",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x2f6,pTVar3);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

TEST(SimpleString, StringFromConstSimpleString)
{
	STRCMP_EQUAL("bla", StringFrom(SimpleString("bla")).asCharString());
}